

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_destroy_context(sexp ctx)

{
  sexp_conflict psVar1;
  long in_RDI;
  size_t sum_freed;
  sexp_heap_conflict tmp;
  sexp_heap_conflict heap;
  size_t *in_stack_00000028;
  sexp_conflict in_stack_00000030;
  sexp_conflict in_stack_00000038;
  sexp_conflict in_stack_ffffffffffffffd8;
  sexp_conflict in_stack_ffffffffffffffe0;
  long local_18;
  sexp local_8;
  
  if (*(long *)(in_RDI + 0x70) != 0) {
    local_18 = *(long *)(in_RDI + 0x70);
    *(undefined1 *)(in_RDI + 4) = 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x28) + 4) = 1;
    sexp_mark(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    psVar1 = sexp_finalize(in_stack_00000038);
    if (psVar1 == (sexp_conflict)&DAT_0000003e) {
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    sexp_sweep(in_stack_00000030,in_stack_00000028);
    psVar1 = sexp_finalize(in_stack_00000038);
    if (psVar1 == (sexp_conflict)&DAT_0000003e) {
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    *(undefined8 *)(in_RDI + 0x70) = 0;
    while (local_18 != 0) {
      local_18 = *(long *)(local_18 + 0x20);
      sexp_free_heap((sexp_heap_conflict)0x1129ce);
    }
  }
  local_8 = (sexp)&DAT_0000013e;
  return local_8;
}

Assistant:

sexp sexp_destroy_context (sexp ctx) {
  sexp_heap heap, tmp;
  size_t sum_freed;
  if (sexp_context_heap(ctx)) {
    heap = sexp_context_heap(ctx);
#if SEXP_USE_DEBUG_GC
    sexp_debug_heap_stats(heap);
#endif
#if SEXP_USE_TRACK_ALLOC_TIMES
    sexp_debug_alloc_times(ctx);
#endif
#if SEXP_USE_TRACK_ALLOC_SIZES
    sexp_debug_alloc_sizes(ctx);
#endif
    sexp_markedp(ctx) = 1;
    sexp_markedp(sexp_context_globals(ctx)) = 1;
    sexp_mark(ctx, sexp_global(ctx, SEXP_G_TYPES));
    if (sexp_finalize(ctx) == SEXP_FALSE) { return SEXP_FALSE; }
    sexp_sweep(ctx, &sum_freed);
    if (sexp_finalize(ctx) == SEXP_FALSE) { return SEXP_FALSE; }
    sexp_context_heap(ctx) = NULL;
    for ( ; heap; heap=tmp) {
      tmp = heap->next;
      sexp_free_heap(heap);
    }
  }
  return SEXP_TRUE;
}